

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O0

void __thiscall
TPZTransfer<std::complex<double>_>::MultAdd
          (TPZTransfer<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *x,
          TPZFMatrix<std::complex<double>_> *y,TPZFMatrix<std::complex<double>_> *z,
          complex<double> alpha,complex<double> beta,int opt)

{
  complex<double> beta_00;
  int64_t iVar1;
  int64_t iVar2;
  complex<double> *pcVar3;
  TPZBaseMatrix *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  int in_R8D;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  TPZFMatrix<std::complex<double>_> *in_XMM1_Qa;
  TPZFMatrix<std::complex<double>_> *pTVar4;
  TPZFMatrix<std::complex<double>_> *pTVar5;
  TPZFMatrix<std::complex<double>_> *in_XMM3_Qa;
  int c_2;
  int i_1;
  int c_1;
  int i;
  TPZFMatrix<std::complex<double>_> tempfine;
  TPZFMatrix<std::complex<double>_> tempcoarse;
  int iv;
  int thisc;
  int thisr;
  int ncc;
  int nrc;
  int r;
  int c;
  int ic;
  int xcols;
  int rows;
  TPZFMatrix<std::complex<double>_> *in_stack_00000278;
  TPZFMatrix<std::complex<double>_> *in_stack_00000280;
  TPZFMatrix<std::complex<double>_> *in_stack_00000288;
  TPZTransfer<std::complex<double>_> *in_stack_00000290;
  complex<double> in_stack_00000298;
  complex<double> in_stack_000002a8;
  complex<double> *in_stack_fffffffffffffda0;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffda8;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffdb0;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffde0;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  int64_t in_stack_fffffffffffffdf8;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffe00;
  int local_1d4;
  int local_1d0;
  TPZFMatrix<std::complex<double>_> local_1c0 [2];
  int local_9c;
  undefined4 local_98;
  int local_94;
  int local_90;
  undefined4 local_8c;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  
  if (in_R8D == 0) {
    iVar1 = TPZBaseMatrix::Cols(in_RDI);
    iVar2 = TPZBaseMatrix::Rows(in_RSI);
    if (iVar1 == iVar2) goto LAB_011cf4d3;
LAB_011cf506:
    TPZMatrix<std::complex<double>_>::Error(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else {
LAB_011cf4d3:
    if (in_R8D != 0) {
      iVar1 = TPZBaseMatrix::Rows(in_RDI);
      iVar2 = TPZBaseMatrix::Rows(in_RSI);
      if (iVar1 != iVar2) goto LAB_011cf506;
    }
  }
  iVar1 = TPZBaseMatrix::Cols(in_RSI);
  iVar2 = TPZBaseMatrix::Cols(in_RDX);
  if (iVar1 == iVar2) {
    iVar1 = TPZBaseMatrix::Cols(in_RSI);
    iVar2 = TPZBaseMatrix::Cols(in_RCX);
    if (iVar1 == iVar2) goto LAB_011cf57e;
  }
  TPZMatrix<std::complex<double>_>::Error(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
LAB_011cf57e:
  TPZBlock::MaxBlockSize((TPZBlock *)0x11cf58c);
  TPZBaseMatrix::Cols(in_RSI);
  beta_00._M_value._8_8_ = in_stack_fffffffffffffe00;
  beta_00._M_value._0_8_ = in_stack_fffffffffffffdf8;
  TPZMatrix<std::complex<double>_>::PrepareZ
            ((TPZMatrix<std::complex<double>_> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),in_stack_fffffffffffffde8
             ,in_stack_fffffffffffffde0,beta_00,(int)((ulong)in_RDI >> 0x20));
  if (*(int *)&in_RDI->field_0x1c == 1) {
    MultAddScalar(in_stack_00000290,in_stack_00000288,in_stack_00000280,in_stack_00000278,
                  in_stack_000002a8,in_stack_00000298,alpha._M_value._12_4_);
  }
  else {
    iVar1 = TPZBaseMatrix::Rows(in_RSI);
    local_8c = (undefined4)iVar1;
    iVar1 = TPZBaseMatrix::Cols(in_RSI);
    local_90 = (int)iVar1;
    iVar1 = TPZBaseMatrix::Rows(in_RDI);
    local_94 = (int)(iVar1 / (long)*(int *)&in_RDI->field_0x1c);
    iVar1 = TPZBaseMatrix::Cols(in_RDI);
    local_98 = (undefined4)(iVar1 / (long)*(int *)&in_RDI->field_0x1c);
    for (local_9c = 0; local_9c < *(int *)&in_RDI->field_0x1c; local_9c = local_9c + 1) {
      TPZFMatrix<std::complex<double>_>::TPZFMatrix
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      TPZFMatrix<std::complex<double>_>::TPZFMatrix
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      for (local_1d0 = 0; local_1d0 < local_94; local_1d0 = local_1d0 + 1) {
        for (local_1d4 = 0; local_1d4 < local_90; local_1d4 = local_1d4 + 1) {
          (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x24])
                    (in_RSI,(long)(local_9c + local_1d0 * *(int *)&in_RDI->field_0x1c),
                     (long)local_1d4);
          pTVar5 = (TPZFMatrix<std::complex<double>_> *)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          pTVar4 = pTVar5;
          in_stack_fffffffffffffda8 = in_XMM3_Qa;
          in_stack_fffffffffffffdb0 = pTVar5;
          in_stack_fffffffffffffda0 =
               TPZFMatrix<std::complex<double>_>::operator()
                         (pTVar5,(int64_t)in_XMM3_Qa,(int64_t)in_stack_fffffffffffffda0);
          *(TPZFMatrix<std::complex<double>_> **)in_stack_fffffffffffffda0->_M_value = pTVar5;
          *(TPZFMatrix<std::complex<double>_> **)(in_stack_fffffffffffffda0->_M_value + 8) =
               in_XMM3_Qa;
          in_XMM3_Qa = pTVar4;
        }
      }
      std::complex<double>::complex((complex<double> *)&stack0xfffffffffffffdf8,0.0,0.0);
      in_XMM3_Qa = in_XMM1_Qa;
      MultAddScalar(in_stack_00000290,in_stack_00000288,in_stack_00000280,in_stack_00000278,
                    in_stack_000002a8,in_stack_00000298,alpha._M_value._12_4_);
      for (in_stack_fffffffffffffdf4 = 0; in_stack_fffffffffffffdf4 < local_94;
          in_stack_fffffffffffffdf4 = in_stack_fffffffffffffdf4 + 1) {
        for (in_stack_fffffffffffffdf0 = 0; in_stack_fffffffffffffdf0 < local_90;
            in_stack_fffffffffffffdf0 = in_stack_fffffffffffffdf0 + 1) {
          TPZFMatrix<std::complex<double>_>::GetVal
                    (local_1c0,(long)in_stack_fffffffffffffdf4,(long)in_stack_fffffffffffffdf0);
          pTVar5 = (TPZFMatrix<std::complex<double>_> *)
                   CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
          pTVar4 = pTVar5;
          pcVar3 = TPZFMatrix<std::complex<double>_>::operator()
                             (in_stack_fffffffffffffdb0,(int64_t)in_stack_fffffffffffffda8,
                              (int64_t)in_stack_fffffffffffffda0);
          *(TPZFMatrix<std::complex<double>_> **)pcVar3->_M_value = pTVar4;
          *(TPZFMatrix<std::complex<double>_> **)(pcVar3->_M_value + 8) = in_XMM3_Qa;
          in_XMM3_Qa = pTVar5;
        }
      }
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x11cf9f7)
      ;
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x11cfa04)
      ;
    }
  }
  return;
}

Assistant:

void TPZTransfer<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                                      TVar alpha, TVar beta, int opt) const{
    // multiplies the transfer matrix and puts the result in z
    if ((!opt && this->Cols() != x.Rows()) || (opt && this->Rows() != x.Rows()))
        this->Error( "TPZTransfer<TVar>::MultAdd <matrices with incompatible dimensions>" );
    if(x.Cols() != y.Cols() || x.Cols() != z.Cols()) {
        this->Error ("TPZTransfer<TVar>::MultiplyAdd incompatible dimensions\n");
    }
    int rows = fRowBlock.MaxBlockSize();
    int xcols = x.Cols();
    int ic, c, r;
    this->PrepareZ(y,z,beta,opt);
    if (fNTVarVar == 1) {
        MultAddScalar(x, y, z, alpha, beta, opt);
    }
    else
    {
        int nrc = x.Rows();
        int ncc = x.Cols();
        int thisr = this->Rows()/fNTVarVar;
        int thisc = this->Cols()/fNTVarVar;
        for(int iv=0; iv<fNTVarVar; iv++) {
            TPZFMatrix<TVar> tempcoarse(thisc,ncc), tempfine(thisr,ncc);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncc; c++) {
                    tempcoarse(i,c) = x.GetVal(iv+i*fNTVarVar,c);
                }
            }
            MultAddScalar(tempcoarse, tempfine, tempfine, alpha, 0., opt);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncc; c++) {
                    z(iv+i*fNTVarVar,c) = tempfine.GetVal(i,c);
                }
            }
        }
    }
}